

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::ShaderSubroutine::NegativeTest12::getTestCaseString_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest12 *this,_test_case *test_case)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"?","");
  if ((ulong)*test_case < 5) {
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               (ulong)(&DAT_01aa4228 + *(int *)(&DAT_01aa4228 + (ulong)*test_case * 4)));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NegativeTest12::getTestCaseString(const _test_case& test_case)
{
	std::string result = "?";

	switch (test_case)
	{
	case TEST_CASE_INVALID_LOCAL_SUBROUTINE_VARIABLE:
		result = "TEST_CASE_INVALID_LOCAL_SUBROUTINE_VARIABLE";
		break;
	case TEST_CASE_INVALID_GLOBAL_SUBROUTINE_VARIABLE:
		result = "TEST_CASE_INVALID_GLOBAL_SUBROUTINE_VARIABLE";
		break;
	case TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR:
		result = "TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR";
		break;
	case TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR_ARGUMENT:
		result = "TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR_ARGUMENT";
		break;
	case TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR_RETURN_TYPE:
		result = "TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR_RETURN_TYPE";
		break;
	default:
		break;
	}

	return result;
}